

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bitileave.cpp
# Opt level: O1

void __thiscall
bitmanip::anon_unknown_0::Test_bitileave_ileaveBytes_bitCountPreserved_::
~Test_bitileave_ileaveBytes_bitCountPreserved_(Test_bitileave_ileaveBytes_bitCountPreserved_ *this)

{
  Test::~Test(&this->super_Test);
  operator_delete(this,0x18);
  return;
}

Assistant:

BITMANIP_TEST(bitileave, ileaveBytes_bitCountPreserved)
{
    constexpr size_t iterations = 1024 * 16;

    fast_rng64 rng{12345};
    std::uniform_int_distribution<std::uint64_t> distr;

    for (size_t i = 0; i < iterations; ++i) {
        std::uint8_t count = i % 9;
        std::uint64_t next = distr(rng);
        std::uint64_t bytesAsInt = count == 0 ? 0 : next >> ((8 - count) * 8);

        std::uint64_t ileaved = ileaveBytes(bytesAsInt, count);
        BITMANIP_ASSERT_EQ(popCount(ileaved), popCount(bytesAsInt));
    }
}